

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestForeignDiscard(void)

{
  _Alloc_hider _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a1;
  undefined4 local_1f4;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  OutputBuffer buf;
  size_type local_1c0;
  undefined4 *local_1b8;
  size_type *local_1b0;
  begin local_1a8;
  undefined4 **local_190;
  assertion_result local_188;
  string hello;
  string world;
  string there;
  string again;
  const_string local_f0;
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  lazy_ostream local_50;
  undefined8 *local_40;
  char *local_38;
  
  local_1a8.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1a8.m_file_name.m_end = "";
  local_1a8.m_line_num = 0x42c;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  hello._M_dataplus._M_p._0_1_ = 1;
  local_1f0[8] = false;
  local_1f0._0_8_ = &PTR__lazy_ostream_001dc770;
  local_1e0._0_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1e0._8_8_ = "TestForeign";
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)local_1f0);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&hello);
  hello._M_dataplus._M_p = (pointer)&hello.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hello,"hello ","");
  again._M_dataplus._M_p = (pointer)&again.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&again,"again ","");
  there._M_dataplus._M_p = (pointer)&there.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&there,"there ","");
  world._M_dataplus._M_p = (pointer)&world.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&world,"world ","");
  avro::OutputBuffer::OutputBuffer(&buf,0);
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,hello._M_dataplus._M_p,hello._M_string_length);
  _Var1 = again._M_dataplus;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,again._M_dataplus._M_p,
             again._M_dataplus._M_p + again._M_string_length);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            (&local_78,(boost *)deleteForeign,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             local_c0,in_RCX);
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void()> *)local_1f0,&local_78,0);
  a1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0;
  avro::detail::BufferImpl::appendForeignData
            (buf.pimpl_.px,_Var1._M_p,again._M_string_length,(free_func *)a1);
  boost::function0<void>::~function0((function0<void> *)local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.l_.
         super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .a1_.t_._M_dataplus._M_p !=
      &local_78.l_.
       super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .a1_.t_.field_2) {
    operator_delete(local_78.l_.
                    super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .a1_.t_._M_dataplus._M_p,
                    local_78.l_.
                    super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .a1_.t_.field_2._M_allocated_capacity + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  _Var1._M_p = there._M_dataplus._M_p;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,there._M_dataplus._M_p,
             there._M_dataplus._M_p + there._M_string_length);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            (&local_a0,(boost *)deleteForeign,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             local_e0,a1);
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void()> *)local_1f0,&local_a0,0);
  avro::detail::BufferImpl::appendForeignData
            (buf.pimpl_.px,_Var1._M_p,there._M_string_length,(free_func *)local_1f0);
  boost::function0<void>::~function0((function0<void> *)local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.l_.
         super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .a1_.t_._M_dataplus._M_p !=
      &local_a0.l_.
       super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .a1_.t_.field_2) {
    operator_delete(local_a0.l_.
                    super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .a1_.t_._M_dataplus._M_p,
                    local_a0.l_.
                    super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .a1_.t_.field_2._M_allocated_capacity + 1);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,world._M_dataplus._M_p,world._M_string_length);
  avro::InputBuffer::InputBuffer((InputBuffer *)local_1f0,&buf);
  printBuffer((InputBuffer *)local_1f0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f0 + 8));
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x43a;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_1c0 = (buf.pimpl_.px)->size_;
  local_1b0 = &local_1c0;
  local_1b8 = &local_1f4;
  local_1f4 = 0x18;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1c0 == 0x18);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_f0.m_end = "";
  local_1e0._8_8_ = &local_1b0;
  local_1f0[8] = false;
  local_1f0._0_8_ = &PTR__lazy_ostream_001dc7f0;
  local_1e0._0_8_ = &boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1b8;
  local_1a8.m_file_name.m_end = (iterator)((ulong)local_1a8.m_file_name.m_end & 0xffffffffffffff00);
  local_1a8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc830;
  local_1a8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,&local_50,&local_f0,0x43a,CHECK,CHECK_EQUAL,2,"buf.size()",
             (InputBuffer *)local_1f0,"24U",&local_1a8);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  avro::OutputBuffer::discardData(&buf,9);
  avro::InputBuffer::InputBuffer((InputBuffer *)local_1f0,&buf);
  printBuffer((InputBuffer *)local_1f0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f0 + 8));
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x43f;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_1c0 = (buf.pimpl_.px)->size_;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1c0 == 0xf);
  local_1f4 = 0xf;
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_f0.m_end = "";
  local_1b0 = &local_1c0;
  local_1f0[8] = false;
  local_1f0._0_8_ = &PTR__lazy_ostream_001dc7f0;
  local_1e0._0_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1e0._8_8_ = &local_1b0;
  local_1b8 = &local_1f4;
  local_1a8.m_file_name.m_end = (iterator)((ulong)local_1a8.m_file_name.m_end & 0xffffffffffffff00);
  local_1a8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc830;
  local_1a8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,&local_50,&local_f0,0x43f,CHECK,CHECK_EQUAL,2,"buf.size()",
             (InputBuffer *)local_1f0,"15U",&local_1a8);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  safeToDelete = true;
  avro::OutputBuffer::discardData(&buf,6);
  safeToDelete = false;
  avro::InputBuffer::InputBuffer((InputBuffer *)local_1f0,&buf);
  printBuffer((InputBuffer *)local_1f0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f0 + 8));
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x446;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_1c0 = (buf.pimpl_.px)->size_;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1c0 == 9);
  local_1f4 = 9;
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_f0.m_end = "";
  local_1b0 = &local_1c0;
  local_1f0[8] = false;
  local_1f0._0_8_ = &PTR__lazy_ostream_001dc7f0;
  local_1e0._0_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1e0._8_8_ = &local_1b0;
  local_1b8 = &local_1f4;
  local_1a8.m_file_name.m_end = (iterator)((ulong)local_1a8.m_file_name.m_end & 0xffffffffffffff00);
  local_1a8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc830;
  local_1a8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,&local_50,&local_f0,0x446,CHECK,CHECK_EQUAL,2,"buf.size()",
             (InputBuffer *)local_1f0,"9U",&local_1a8);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  safeToDelete = true;
  avro::OutputBuffer::discardData(&buf,3);
  safeToDelete = false;
  avro::InputBuffer::InputBuffer((InputBuffer *)local_1f0,&buf);
  printBuffer((InputBuffer *)local_1f0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f0 + 8));
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x44d;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_1c0 = (buf.pimpl_.px)->size_;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1c0 == 6);
  local_1f4 = 6;
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_f0.m_end = "";
  local_1b0 = &local_1c0;
  local_1f0[8] = false;
  local_1f0._0_8_ = &PTR__lazy_ostream_001dc7f0;
  local_1e0._0_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1e0._8_8_ = &local_1b0;
  local_1b8 = &local_1f4;
  local_1a8.m_file_name.m_end = (iterator)((ulong)local_1a8.m_file_name.m_end & 0xffffffffffffff00);
  local_1a8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc830;
  local_1a8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,&local_50,&local_f0,0x44d,CHECK,CHECK_EQUAL,2,"buf.size()",
             (InputBuffer *)local_1f0,"6U",&local_1a8);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::detail::shared_count::~shared_count(&buf.pimpl_.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)world._M_dataplus._M_p != &world.field_2) {
    operator_delete(world._M_dataplus._M_p,world.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)there._M_dataplus._M_p != &there.field_2) {
    operator_delete(there._M_dataplus._M_p,there.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)again._M_dataplus._M_p != &again.field_2) {
    operator_delete(again._M_dataplus._M_p,again.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hello._M_dataplus._M_p != &hello.field_2) {
    operator_delete(hello._M_dataplus._M_p,hello.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestForeignDiscard ()  
{
    BOOST_TEST_MESSAGE( "TestForeign");
    {
        std::string hello = "hello ";
        std::string again = "again ";
        std::string there = "there ";
        std::string world = "world ";

        OutputBuffer buf;
        buf.writeTo(hello.c_str(), hello.size());
        buf.appendForeignData(again.c_str(), again.size(), boost::bind(&deleteForeign, again));
        buf.appendForeignData(there.c_str(), there.size(), boost::bind(&deleteForeign, there));
        buf.writeTo(world.c_str(), world.size());
        
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 24U);

        // discard some data including half the foreign buffer
        buf.discardData(9);
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 15U);
        
        // discard some more data, which will lop off the first foreign buffer
        safeToDelete = true;
        buf.discardData(6);
        safeToDelete = false;
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 9U);

        // discard some more data, which will lop off the second foreign buffer
        safeToDelete = true;
        buf.discardData(3);
        safeToDelete = false;
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 6U);
    }
}